

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

GPU_RendererID * GPU_GetRendererID(GPU_RendererID *__return_storage_ptr__,GPU_RendererEnum renderer)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  
  gpu_init_renderer_register();
  lVar2 = -0x28;
  do {
    lVar3 = lVar2;
    if (lVar3 + 0x28 == 400) {
      GPU_MakeRendererID(__return_storage_ptr__,"Unknown",0,0,0);
      return __return_storage_ptr__;
    }
    lVar2 = lVar3 + 0x28;
  } while (*(GPU_RendererEnum *)((long)&_gpu_renderer_register[1].id.renderer + lVar3) != renderer);
  *(undefined8 *)&__return_storage_ptr__->minor_version =
       *(undefined8 *)((long)&_gpu_renderer_register[1].id.minor_version + lVar3);
  uVar1 = *(undefined8 *)((long)&_gpu_renderer_register[1].id.renderer + lVar3);
  __return_storage_ptr__->name = *(char **)((long)&_gpu_renderer_register[1].id.name + lVar3);
  __return_storage_ptr__->renderer = (int)uVar1;
  __return_storage_ptr__->major_version = (int)((ulong)uVar1 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

GPU_RendererID GPU_GetRendererID(GPU_RendererEnum renderer)
{
	int i;

	gpu_init_renderer_register();

	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == renderer)
			return _gpu_renderer_register[i].id;
	}
	
	return GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0);
}